

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.cpp
# Opt level: O0

void __thiscall Assimp::Blender::SectionParser::Next(SectionParser *this)

{
  int32_t iVar1;
  uint32_t uVar2;
  uint uVar3;
  pos pVar4;
  DeadlyImportError *this_00;
  Logger *this_01;
  uint64_t local_a8;
  int local_90;
  int local_8c;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38 [36];
  int8_t local_14;
  int8_t local_13;
  char local_12;
  int8_t local_11;
  SectionParser *pSStack_10;
  char tmp [4];
  SectionParser *this_local;
  
  pSStack_10 = this;
  StreamReader<true,_true>::SetCurrentPos
            (this->stream,(ulong)(this->current).start + (this->current).size);
  local_14 = StreamReader<true,_true>::GetI1(this->stream);
  local_13 = StreamReader<true,_true>::GetI1(this->stream);
  local_12 = StreamReader<true,_true>::GetI1(this->stream);
  local_11 = StreamReader<true,_true>::GetI1(this->stream);
  if (local_11 == '\0') {
    if (local_12 == '\0') {
      local_90 = 1;
      if (local_13 != '\0') {
        local_90 = 2;
      }
    }
    else {
      local_90 = 3;
    }
    local_8c = local_90;
  }
  else {
    local_8c = 4;
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_38,&local_14,(long)local_8c,&local_39);
  ::std::__cxx11::string::operator=((string *)&(this->current).id,local_38);
  ::std::__cxx11::string::~string(local_38);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  iVar1 = StreamReader<true,_true>::GetI4(this->stream);
  (this->current).size = (long)iVar1;
  if ((this->ptr64 & 1U) == 0) {
    uVar2 = StreamReader<true,_true>::GetU4(this->stream);
    local_a8 = (uint64_t)uVar2;
  }
  else {
    local_a8 = StreamReader<true,_true>::GetU8(this->stream);
  }
  (this->current).address.val = local_a8;
  uVar3 = StreamReader<true,_true>::GetI4(this->stream);
  (this->current).dna_index = uVar3;
  iVar1 = StreamReader<true,_true>::GetI4(this->stream);
  (this->current).num = (long)iVar1;
  pVar4 = StreamReader<true,_true>::GetCurrentPos(this->stream);
  (this->current).start = pVar4;
  uVar3 = StreamReader<true,_true>::GetRemainingSizeToLimit(this->stream);
  if ((this->current).size <= (ulong)uVar3) {
    this_01 = DefaultLogger::get();
    Logger::debug(this_01,&(this->current).id);
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_70,"BLEND: invalid size of file block",&local_71);
  DeadlyImportError::DeadlyImportError(this_00,&local_70);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void SectionParser :: Next()
{
    stream.SetCurrentPos(current.start + current.size);

    const char tmp[] = {
        (const char)stream.GetI1(),
        (const char)stream.GetI1(),
        (const char)stream.GetI1(),
        (const char)stream.GetI1()
    };
    current.id = std::string(tmp,tmp[3]?4:tmp[2]?3:tmp[1]?2:1);

    current.size = stream.GetI4();
    current.address.val = ptr64 ? stream.GetU8() : stream.GetU4();

    current.dna_index = stream.GetI4();
    current.num = stream.GetI4();

    current.start = stream.GetCurrentPos();
    if (stream.GetRemainingSizeToLimit() < current.size) {
        throw DeadlyImportError("BLEND: invalid size of file block");
    }

#ifdef ASSIMP_BUILD_BLENDER_DEBUG
    ASSIMP_LOG_DEBUG(current.id);
#endif
}